

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O1

int lws_mqtt_client_send_unsubcribe(lws *wsi,lws_mqtt_subscribe_param_t *unsub)

{
  undefined1 *puVar1;
  undefined2 uVar2;
  _lws_mqtt_related *p_Var3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  uint8_t *puVar7;
  uint16_t u;
  byte bVar8;
  ulong uVar9;
  long lVar10;
  uint value;
  int iVar11;
  char *pcVar12;
  lws_mqtt_subs_t *plVar13;
  uchar *puVar14;
  uint8_t send_unsub [8];
  lws_mqtt_str_t mqtt_vh_payload;
  char local_68 [12];
  uint local_5c;
  uchar *local_58;
  lws *local_50;
  uchar *local_48;
  lws_mqtt_str_t local_40;
  
  puVar14 = wsi->context->pt[wsi->tsi].serv_buf;
  local_50 = lws_get_network_wsi(wsi);
  _lws_log(8,"%s: Enter\n","lws_mqtt_client_send_unsubcribe");
  uVar5 = 1;
  if ((short)wsi->wsistate == 0x119) {
    local_48 = puVar14;
    local_68[0] = '\0';
    local_68[1] = '\0';
    local_68[2] = '\0';
    local_68[3] = '\0';
    local_68[4] = '\0';
    local_68[5] = '\0';
    local_68[6] = '\0';
    local_68[7] = '\0';
    if (unsub->num_topics == 0) {
      bVar8 = 0;
    }
    else {
      bVar8 = 0;
      uVar9 = 0;
      do {
        pcVar12 = unsub->topic[uVar9].name;
        plVar13 = (lws_mqtt_subs_t *)&local_50->mqtt->subs_head;
        do {
          plVar13 = plVar13->next;
          if (plVar13 == (lws_mqtt_subs_t *)0x0) {
            plVar13 = (lws_mqtt_subs_t *)0x0;
            break;
          }
          iVar4 = strcmp(&plVar13->field_0x9,pcVar12);
        } while (iVar4 != 0);
        if (plVar13 == (lws_mqtt_subs_t *)0x0) {
          __assert_fail("mysub",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/roles/mqtt/mqtt.c"
                        ,0x79c,
                        "int lws_mqtt_client_send_unsubcribe(struct lws *, const lws_mqtt_subscribe_param_t *)"
                       );
        }
        puVar7 = &plVar13->ref_count;
        *puVar7 = *puVar7 + 0xff;
        if (*puVar7 == '\0') {
          _lws_log(4,"%s: Need to send UNSUB\n","lws_mqtt_client_send_unsubcribe");
          local_68[uVar9] = '\x01';
          bVar8 = bVar8 + 1;
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 < unsub->num_topics);
    }
    if (bVar8 == 0) {
      _lws_log(4,"%s: unsubscribed!\n","lws_mqtt_client_send_unsubcribe");
      uVar5 = user_callback_handle_rxflow
                        (wsi->protocol->callback,wsi,LWS_CALLBACK_MQTT_UNSUBSCRIBED,wsi->user_space,
                         (void *)0x0,0);
      uVar5 = uVar5 >> 0x1f;
    }
    else {
      local_58 = local_48 + 0x10;
      local_5c = (uint)bVar8;
      local_48[0x10] = 0xa2;
      puVar14 = local_48 + 0x11;
      uVar5 = unsub->num_topics;
      if ((ulong)uVar5 == 0) {
        value = 2;
      }
      else {
        value = 2;
        pcVar12 = local_68;
        lVar10 = 0;
        do {
          if (*pcVar12 != '\0') {
            sVar6 = strlen(*(char **)((long)&unsub->topic->name + lVar10));
            value = value + (int)sVar6 + 2;
          }
          pcVar12 = pcVar12 + 1;
          lVar10 = lVar10 + 0x10;
        } while ((ulong)uVar5 << 4 != lVar10);
      }
      wsi->mqtt->sub_size = (uint16_t)value;
      _lws_log(0x10,"%s: Number of topics = %d, Remaining len = %d\n",
               "lws_mqtt_client_send_unsubcribe",(ulong)local_5c,(ulong)value);
      iVar4 = lws_mqtt_vbi_encode(value,puVar14);
      if (((int)(puVar14 + iVar4) - (int)local_58) + value < wsi->context->pt_serv_buf_size) {
        lws_mqtt_str_init(&local_40,puVar14 + iVar4,(uint16_t)value,'\0');
        puVar7 = lws_mqtt_str_next(&local_40,(uint16_t *)0x0);
        p_Var3 = wsi->mqtt;
        uVar2 = p_Var3->pkt_id;
        u = uVar2 + 1;
        p_Var3->pkt_id = u;
        p_Var3->ack_pkt_id = u;
        lws_ser_wu16be(puVar7,u);
        iVar4 = lws_mqtt_str_advance(&local_40,2);
        if (iVar4 == 0) {
          puVar7 = lws_mqtt_str_next(&local_40,(uint16_t *)0x0);
          if (unsub->num_topics != 0) {
            lVar10 = 0;
            uVar9 = 0;
            do {
              _lws_log(8,"%s: topics[%d] = %s\n","lws_mqtt_client_send_unsubcribe",
                       uVar9 & 0xffffffff,*(undefined8 *)((long)&unsub->topic->name + lVar10));
              if (local_68[uVar9] != '\0') {
                sVar6 = strlen(*(char **)((long)&unsub->topic->name + lVar10));
                lws_ser_wu16be(puVar7,(uint16_t)sVar6);
                iVar4 = lws_mqtt_str_advance(&local_40,2);
                if (iVar4 != 0) goto LAB_0011ae24;
                puVar7 = lws_mqtt_str_next(&local_40,(uint16_t *)0x0);
                pcVar12 = *(char **)((long)&unsub->topic->name + lVar10);
                sVar6 = strlen(pcVar12);
                lws_strncpy((char *)puVar7,pcVar12,sVar6 + 1);
                sVar6 = strlen(*(char **)((long)&unsub->topic->name + lVar10));
                iVar4 = lws_mqtt_str_advance(&local_40,(int)sVar6);
                if (iVar4 != 0) goto LAB_0011ae24;
                puVar7 = lws_mqtt_str_next(&local_40,(uint16_t *)0x0);
              }
              uVar9 = uVar9 + 1;
              lVar10 = lVar10 + 0x10;
            } while (uVar9 < unsub->num_topics);
          }
          iVar11 = (int)puVar7 - (int)local_58;
          uVar5 = 1;
          iVar4 = lws_write(local_50,local_58,(long)iVar11,LWS_WRITE_BINARY);
          if (iVar4 == iVar11) {
            puVar1 = &wsi->mqtt->field_0xfe;
            *puVar1 = *puVar1 | 0x10;
            uVar5 = 0;
          }
        }
        else {
LAB_0011ae24:
          uVar5 = 1;
        }
      }
      else {
        uVar5 = 1;
        _lws_log(1,"%s: Payload is too big\n","lws_mqtt_client_send_unsubcribe");
      }
    }
  }
  return uVar5;
}

Assistant:

int
lws_mqtt_client_send_unsubcribe(struct lws *wsi,
				const lws_mqtt_subscribe_param_t *unsub)
{
	struct lws_context_per_thread *pt = &wsi->context->pt[(int)wsi->tsi];
	uint8_t *b = (uint8_t *)pt->serv_buf + LWS_PRE, *start = b, *p = start;
	struct lws *nwsi = lws_get_network_wsi(wsi);
	lws_mqtt_str_t mqtt_vh_payload;
	uint8_t send_unsub[8], orphaned;
	uint32_t rem_len, n;
	uint32_t __attribute__((unused)) tops;
	lws_mqtt_subs_t *mysub;

	lwsl_info("%s: Enter\n", __func__);

	switch (lwsi_state(wsi)) {
	case LRS_ESTABLISHED: /* Protocol connection established */
		orphaned = 0;
		memset(&send_unsub, 0, sizeof(send_unsub));
		for (n = 0; n < unsub->num_topics; n++) {
			mysub = lws_mqtt_find_sub(nwsi->mqtt,
						  unsub->topic[n].name);
			assert(mysub);

			if (--mysub->ref_count == 0) {
				lwsl_notice("%s: Need to send UNSUB\n", __func__);
				send_unsub[n] = 1;
				orphaned++;
			}
		}

		if (!orphaned) {
			/*
			 * The nwsi still has other subscribers bound to the
			 * topics.
			 *
			 * So, don't send UNSUB to server, and just fake the
			 * UNSUB ACK event for the guy going away.
			 */
			lwsl_notice("%s: unsubscribed!\n", __func__);
			if (user_callback_handle_rxflow(
				    wsi->protocol->callback,
				    wsi, LWS_CALLBACK_MQTT_UNSUBSCRIBED,
				    wsi->user_space, NULL, 0) < 0) {
				/*
				 * We can't directly close here, because the
				 * caller still has the wsi.  Inform the
				 * caller that we want to close
				 */

				return 1;
			}

			return 0;
		}

		/*
		 * one or more of the topics needs to be unsubscribed
		 * from, so we must go to the server with a filtered
		 * list of the new ones only
		 */

		tops = orphaned;

		if (lws_mqtt_fill_fixed_header(p++, LMQCP_CTOS_UNSUBSCRIBE,
					       0, 0, 0)) {
			lwsl_err("%s: Failed to fill fixed header\n", __func__);
			return 1;
		}

		/*
		 * Pid + (Topic len field + Topic len) x Num of Topics
		 */
		rem_len = 2;
		for (n = 0; n < unsub->num_topics; n++)
			if (send_unsub[n])
				rem_len += (2 + strlen(unsub->topic[n].name));

		wsi->mqtt->sub_size = rem_len;

		lwsl_debug("%s: Number of topics = %d, Remaining len = %d\n",
			   __func__, (int)tops, (int)rem_len);

		p += lws_mqtt_vbi_encode(rem_len, p);

		if ((rem_len + lws_ptr_diff(p, start)) >=
					       wsi->context->pt_serv_buf_size) {
			lwsl_err("%s: Payload is too big\n", __func__);
			return 1;
		}

		/* Init lws_mqtt_str */
		lws_mqtt_str_init(&mqtt_vh_payload, (uint8_t *)p, rem_len, 0);
		p = lws_mqtt_str_next(&mqtt_vh_payload, NULL);

		/* Packet ID */
		wsi->mqtt->ack_pkt_id = ++wsi->mqtt->pkt_id;
		lws_ser_wu16be(p, wsi->mqtt->ack_pkt_id);

		if (lws_mqtt_str_advance(&mqtt_vh_payload, 2))
			return 1;

		p = lws_mqtt_str_next(&mqtt_vh_payload, NULL);

		for (n = 0; n < unsub->num_topics; n++) {
			lwsl_info("%s: topics[%d] = %s\n", __func__,
				   (int)n, unsub->topic[n].name);

			/*
			 * Subscriber still bound to it, don't UBSUB
			 * from the server
			 */
			if (!send_unsub[n])
				continue;

			/* Topic's Len */
			lws_ser_wu16be(p, strlen(unsub->topic[n].name));
			if (lws_mqtt_str_advance(&mqtt_vh_payload, 2))
				return 1;
			p = lws_mqtt_str_next(&mqtt_vh_payload, NULL);

			/* Topic Name */
			lws_strncpy((char *)p, unsub->topic[n].name,
				    strlen(unsub->topic[n].name) + 1);
			if (lws_mqtt_str_advance(&mqtt_vh_payload,
						 strlen(unsub->topic[n].name)))
				return 1;
			p = lws_mqtt_str_next(&mqtt_vh_payload, NULL);
		}
		break;

	default:
		return 1;
	}

	if (lws_write(nwsi, start, lws_ptr_diff(p, start), LWS_WRITE_BINARY) !=
					lws_ptr_diff(p, start))
		return 1;

	wsi->mqtt->inside_unsubscribe = 1;

	return 0;
}